

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

void lj_debug_dumpstack(lua_State *L,SBuf *sb,char *fmt,int depth)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  cTValue *pcVar5;
  GCfunc *fn;
  char *pcVar6;
  size_t sVar7;
  byte *pbVar8;
  char *pcVar9;
  uint uVar10;
  byte *pbVar11;
  ulong uVar12;
  int pathstrip;
  int size;
  char *name;
  int local_70;
  int local_6c;
  lua_State *local_68;
  int local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  cTValue *local_48;
  cTValue *local_40;
  char *local_38;
  
  local_5c = depth >> 0x1f | 1;
  uVar10 = 0xffffffff;
  if (depth < -1) {
    uVar10 = depth;
  }
  uVar10 = ~uVar10;
  local_58 = 0xffffffff;
  if (-1 < depth) {
    local_58 = depth;
  }
  pathstrip = 1;
  local_70 = 0;
  local_68 = L;
  local_60 = depth;
  local_50 = (byte *)fmt;
  do {
    if (uVar10 == local_58) break;
    pcVar5 = lj_debug_frame(local_68,uVar10,&local_6c);
    if (pcVar5 != (cTValue *)0x0) {
      local_48 = pcVar5 + local_6c;
      if ((long)local_6c == 0) {
        local_48 = (cTValue *)0x0;
      }
      fn = (GCfunc *)(ulong)(pcVar5->u32).lo;
      pbVar11 = local_50;
      iVar4 = pathstrip;
      local_54 = uVar10;
      local_40 = pcVar5;
LAB_00112765:
      pathstrip = iVar4;
      bVar1 = *pbVar11;
      pbVar11 = pbVar11 + 1;
      if (bVar1 < 0x66) {
        if (bVar1 != 0x46) {
          if (bVar1 != 0x5a) {
            uVar10 = local_54;
            if (bVar1 != 0) goto LAB_001128f1;
            goto LAB_00112995;
          }
          local_70 = (sb->p).ptr32 - (sb->b).ptr32;
          iVar4 = pathstrip;
          goto LAB_00112765;
        }
LAB_001127af:
        pcVar6 = lj_debug_funcname(local_68,local_40,&local_38);
        if (pcVar6 == (char *)0x0) goto LAB_00112830;
        if (((bVar1 == 0x46) && ((fn->c).ffid == '\0')) &&
           (uVar12 = (ulong)(fn->c).pc.ptr32, *(int *)(uVar12 - 0x14) != -1)) {
          debug_putchunkname(sb,(GCproto *)(uVar12 - 0x40),pathstrip);
          uVar10 = (sb->p).ptr32;
          pcVar9 = (char *)(ulong)uVar10;
          if ((sb->e).ptr32 == uVar10) {
            pcVar9 = lj_buf_more2(sb,1);
          }
          *pcVar9 = ':';
          (sb->p).ptr32 = (int)pcVar9 + 1;
        }
        pcVar9 = local_38;
        sVar7 = strlen(local_38);
        lj_buf_putmem(sb,pcVar9,(MSize)sVar7);
        iVar4 = pathstrip;
        if (pcVar6 != (char *)0x0) goto LAB_00112765;
      }
      else {
        iVar4 = 0;
        if (bVar1 == 0x70) goto LAB_00112765;
        if (bVar1 != 0x6c) {
          if (bVar1 == 0x66) goto LAB_001127af;
LAB_001128f1:
          uVar10 = (sb->p).ptr32;
          pbVar8 = (byte *)(ulong)uVar10;
          if ((sb->e).ptr32 == uVar10) {
            pbVar8 = (byte *)lj_buf_more2(sb,1);
          }
          iVar4 = (int)pbVar8;
          *pbVar8 = bVar1;
          goto LAB_001128fe;
        }
      }
LAB_00112830:
      if ((fn->c).ffid == '\x01') {
        uVar10 = (sb->p).ptr32;
        pcVar6 = (char *)(ulong)uVar10;
        if ((sb->e).ptr32 == uVar10) {
          pcVar6 = lj_buf_more2(sb,1);
        }
        *pcVar6 = '@';
        (sb->p).ptr32 = (int)pcVar6 + 1;
        lj_strfmt_putptr(sb,(fn->c).f);
        iVar4 = pathstrip;
        goto LAB_00112765;
      }
      if ((fn->c).ffid == '\0') {
        uVar12 = (ulong)(fn->c).pc.ptr32;
        iVar3 = debug_putchunkname(sb,(GCproto *)(uVar12 - 0x40),pathstrip);
        iVar4 = pathstrip;
        if (iVar3 != 0) {
          if (bVar1 == 0x6c) {
            iVar4 = lj_debug_frameline(local_68,fn,local_48);
          }
          else {
            iVar4 = *(int *)(uVar12 - 0x14);
          }
          uVar10 = (sb->p).ptr32;
          pcVar6 = (char *)(ulong)uVar10;
          if ((sb->e).ptr32 == uVar10) {
            pcVar6 = lj_buf_more2(sb,1);
          }
          *pcVar6 = ':';
          (sb->p).ptr32 = (int)pcVar6 + 1;
          if (iVar4 < 0) {
            iVar4 = *(int32_t *)(uVar12 - 0x14);
          }
          lj_strfmt_putint(sb,iVar4);
          iVar4 = pathstrip;
        }
        goto LAB_00112765;
      }
      lj_buf_putmem(sb,"[builtin#",9);
      lj_strfmt_putint(sb,(uint)(fn->c).ffid);
      uVar10 = (sb->p).ptr32;
      pcVar6 = (char *)(ulong)uVar10;
      if ((sb->e).ptr32 == uVar10) {
        pcVar6 = lj_buf_more2(sb,1);
      }
      iVar4 = (int)pcVar6;
      *pcVar6 = ']';
LAB_001128fe:
      (sb->p).ptr32 = iVar4 + 1;
      iVar4 = pathstrip;
      goto LAB_00112765;
    }
    if (local_60 < 0) {
      uVar10 = uVar10 - local_6c;
LAB_00112995:
      uVar10 = uVar10 + local_5c;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  } while (bVar2);
  if (local_70 != 0) {
    (sb->p).ptr32 = local_70 + (sb->b).ptr32;
  }
  return;
}

Assistant:

void lj_debug_dumpstack(lua_State *L, SBuf *sb, const char *fmt, int depth)
{
  int level = 0, dir = 1, pathstrip = 1;
  MSize lastlen = 0;
  if (depth < 0) { level = ~depth; depth = dir = -1; }  /* Reverse frames. */
  while (level != depth) {  /* Loop through all frame. */
    int size;
    cTValue *frame = lj_debug_frame(L, level, &size);
    if (frame) {
      cTValue *nextframe = size ? frame+size : NULL;
      GCfunc *fn = frame_func(frame);
      const uint8_t *p = (const uint8_t *)fmt;
      int c;
      while ((c = *p++)) {
	switch (c) {
	case 'p':  /* Preserve full path. */
	  pathstrip = 0;
	  break;
	case 'F': case 'f': {  /* Dump function name. */
	  const char *name;
	  const char *what = lj_debug_funcname(L, frame, &name);
	  if (what) {
	    if (c == 'F' && isluafunc(fn)) {  /* Dump module:name for 'F'. */
	      GCproto *pt = funcproto(fn);
	      if (pt->firstline != ~(BCLine)0) {  /* Not a bytecode builtin. */
		debug_putchunkname(sb, pt, pathstrip);
		lj_buf_putb(sb, ':');
	      }
	    }
	    lj_buf_putmem(sb, name, (MSize)strlen(name));
	    break;
	  }  /* else: can't derive a name, dump module:line. */
	  }
	  /* fallthrough */
	case 'l':  /* Dump module:line. */
	  if (isluafunc(fn)) {
	    GCproto *pt = funcproto(fn);
	    if (debug_putchunkname(sb, pt, pathstrip)) {
	      /* Regular Lua function. */
	      BCLine line = c == 'l' ? lj_debug_frameline(L, fn, nextframe) :
				       pt->firstline;
	      lj_buf_putb(sb, ':');
	      lj_strfmt_putint(sb, line >= 0 ? line : pt->firstline);
	    }
	  } else if (isffunc(fn)) {  /* Dump numbered builtins. */
	    lj_buf_putmem(sb, "[builtin#", 9);
	    lj_strfmt_putint(sb, fn->c.ffid);
	    lj_buf_putb(sb, ']');
	  } else {  /* Dump C function address. */
	    lj_buf_putb(sb, '@');
	    lj_strfmt_putptr(sb, fn->c.f);
	  }
	  break;
	case 'Z':  /* Zap trailing separator. */
	  lastlen = sbuflen(sb);
	  break;
	default:
	  lj_buf_putb(sb, c);
	  break;
	}
      }
    } else if (dir == 1) {
      break;
    } else {
      level -= size;  /* Reverse frame order: quickly skip missing level. */
    }
    level += dir;
  }
  if (lastlen)
    setsbufP(sb, sbufB(sb) + lastlen);  /* Zap trailing separator. */
}